

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O0

void lws_dll2_add_tail(lws_dll2 *d,lws_dll2_owner *owner)

{
  int iVar1;
  lws_dll2_owner *owner_local;
  lws_dll2 *d_local;
  
  iVar1 = lws_dll2_is_detached(d);
  if (iVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                  ,0x76,"void lws_dll2_add_tail(struct lws_dll2 *, struct lws_dll2_owner *)");
  }
  d->prev = owner->tail;
  if (d->prev != (lws_dll2 *)0x0) {
    d->prev->next = d;
  }
  d->next = (lws_dll2 *)0x0;
  owner->tail = d;
  if (owner->head == (lws_dll2 *)0x0) {
    owner->head = d;
  }
  d->owner = owner;
  owner->count = owner->count + 1;
  return;
}

Assistant:

void
lws_dll2_add_tail(struct lws_dll2 *d, struct lws_dll2_owner *owner)
{
	if (!lws_dll2_is_detached(d)) {
		assert(0); /* only wholly detached things can be added */
		return;
	}

	/* our previous guy is current last guy */
	d->prev = owner->tail;
	/* if there is a prev guy, set his next ptr to our prev ptr */
	if (d->prev)
		d->prev->next = d;
	/* our next ptr is NULL */
	d->next = NULL;
	/* set the last guy to be us */
	owner->tail = d;

	/* list head is also us if we're the first */
	if (!owner->head)
		owner->head = d;

	d->owner = owner;
	owner->count++;
}